

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool DynamicProfileStorage::AppendCacheCatalog(char16 *url)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined1 local_40 [8];
  DynamicProfileStorageReaderWriter catalogFile;
  DWORD time;
  DWORD count;
  DWORD version;
  DWORD magic;
  char16 *url_local;
  
  _version = url;
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x339,"(enabled)","enabled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((useCacheDir & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x33a,"(useCacheDir)","useCacheDir");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((locked & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x33b,"(locked)","locked");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DynamicProfileStorageReaderWriter::DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)local_40);
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)local_40,catalogFilename,L"rcb+",false,
                     (errno_t *)0x0);
  if (bVar2) {
    bVar2 = DynamicProfileStorageReaderWriter::Seek((DynamicProfileStorageReaderWriter *)local_40,0)
    ;
    if ((((bVar2) &&
         (bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                            ((DynamicProfileStorageReaderWriter *)local_40,&count), bVar2)) &&
        (bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                           ((DynamicProfileStorageReaderWriter *)local_40,&time), bVar2)) &&
       (((bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                            ((DynamicProfileStorageReaderWriter *)local_40,
                             (uint *)&catalogFile.deleteNonClosed), bVar2 &&
         (bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                            ((DynamicProfileStorageReaderWriter *)local_40,
                             (uint *)&catalogFile.field_0x14), bVar2)) &&
        ((count == 0x132b5ae && (1 < time)))))) {
      if (time < 3) {
        if (((ulong)(uint)catalogFile._16_4_ == creationTime) &&
           (catalogFile._20_4_ + 1 == nextFileId)) {
          bVar2 = DynamicProfileStorageReaderWriter::SeekToEnd
                            ((DynamicProfileStorageReaderWriter *)local_40);
          if ((((bVar2) &&
               (bVar2 = DynamicProfileStorageReaderWriter::WriteUtf8String
                                  ((DynamicProfileStorageReaderWriter *)local_40,_version), bVar2))
              && (bVar2 = DynamicProfileStorageReaderWriter::Seek
                                    ((DynamicProfileStorageReaderWriter *)local_40,0xc), bVar2)) &&
             (bVar2 = DynamicProfileStorageReaderWriter::Write<unsigned_int>
                                ((DynamicProfileStorageReaderWriter *)local_40,&nextFileId), bVar2))
          {
            lastOffset = DynamicProfileStorageReaderWriter::Size
                                   ((DynamicProfileStorageReaderWriter *)local_40);
            url_local._7_1_ = true;
          }
          else {
            bVar2 = DoTrace();
            if (bVar2) {
              Output::Print(
                           L"TRACE: DynamicProfileStorage: Write failure. Cache directory catalog corrupted: \'%s\'\n"
                           );
              Output::Flush();
            }
            DynamicProfileStorageReaderWriter::Close
                      ((DynamicProfileStorageReaderWriter *)local_40,false);
            url_local._7_1_ = CreateCacheCatalog();
          }
        }
        else {
          DisableCacheDir();
          Output::Print(L"ERROR: DynamicProfileStorage: Internal error, file modified under lock\n")
          ;
          Output::Flush();
          url_local._7_1_ = false;
        }
      }
      else {
        DisableCacheDir();
        Output::Print(L"ERROR: DynamicProfileStorage: Existing cache catalog has a newer format\n");
        Output::Flush();
        url_local._7_1_ = false;
      }
    }
    else {
      DynamicProfileStorageReaderWriter::Close((DynamicProfileStorageReaderWriter *)local_40,false);
      bVar2 = DoTrace();
      if (bVar2) {
        Output::Print(L"TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: \'%s\'\n"
                      ,catalogFilename);
        Output::Flush();
      }
      url_local._7_1_ = CreateCacheCatalog();
    }
  }
  else {
    url_local._7_1_ = CreateCacheCatalog();
  }
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)local_40);
  return (bool)(url_local._7_1_ & 1);
}

Assistant:

bool DynamicProfileStorage::AppendCacheCatalog(__in_z char16 const * url)
{
    AssertOrFailFast(enabled);
    AssertOrFailFast(useCacheDir);
    AssertOrFailFast(locked);
    DWORD magic;
    DWORD version;
    DWORD count;
    DWORD time;
    DynamicProfileStorageReaderWriter catalogFile;
    if (!catalogFile.Init(catalogFilename, _u("rcb+"), false))
    {
        return CreateCacheCatalog();
    }

    if (!catalogFile.Seek(0)
        || !catalogFile.Read(&magic)
        || !catalogFile.Read(&version)
        || !catalogFile.Read(&time)
        || !catalogFile.Read(&count)
        || magic != MagicNumber
        || version < FileFormatVersion)
    {
        catalogFile.Close();
#if DBG_DUMP
        if (DynamicProfileStorage::DoTrace())
        {
            Output::Print(_u("TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: '%s'\n"), catalogFilename);
            Output::Flush();
        }
#endif
        return CreateCacheCatalog();
    }

    if (version > FileFormatVersion)
    {
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Existing cache catalog has a newer format\n"));
        Output::Flush();
        return false;
    }

    if (time != creationTime || count + 1 != nextFileId)
    {
        // This should not happen, as we are under lock from the LoadCacheCatalog
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Internal error, file modified under lock\n"));
        Output::Flush();
        return false;
    }

    if (!catalogFile.SeekToEnd() ||
        !catalogFile.WriteUtf8String(url) ||
        !catalogFile.Seek(3 * sizeof(DWORD)) ||
        !catalogFile.Write(nextFileId))
    {
#if DBG_DUMP
        if (DynamicProfileStorage::DoTrace())
        {
            Output::Print(_u("TRACE: DynamicProfileStorage: Write failure. Cache directory catalog corrupted: '%s'\n"), catalogFilename);
            Output::Flush();
        }
#endif
        catalogFile.Close();
        return CreateCacheCatalog();
    }

    lastOffset = catalogFile.Size();
    return true;
}